

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void prvTidyAccessibilityChecks(TidyDocImpl *doc)

{
  Bool BVar1;
  TidyDocImpl *doc_local;
  
  InitAccessibilityChecks(doc,(int)(doc->config).value[1].v);
  prvTidyDialogue(doc,0x1fa);
  CheckScriptKeyboardAccessible(doc,&doc->root);
  CheckForStyleAttribute(doc,&doc->root);
  CheckDocType(doc);
  BVar1 = Level2_Enabled(doc);
  if (BVar1 != no) {
    BVar1 = CheckMissingStyleSheets(doc,&doc->root);
    if (BVar1 == no) {
      prvTidyReportAccessError(doc,&doc->root,0x2b6);
    }
  }
  CheckForListElements(doc,&doc->root);
  AccessibilityCheckNode(doc,&doc->root);
  FreeAccessibilityChecks(doc);
  return;
}

Assistant:

void TY_(AccessibilityChecks)( TidyDocImpl* doc )
{
    /* Initialize */
    InitAccessibilityChecks( doc, cfg(doc, TidyAccessibilityCheckLevel) );

    /* Hello there, ladies and gentlemen... */
    TY_(Dialogue)( doc, STRING_HELLO_ACCESS );

    /* Checks all elements for script accessibility */
    CheckScriptKeyboardAccessible( doc, &doc->root );

    /* Checks entire document for the use of 'STYLE' attribute */
    CheckForStyleAttribute( doc, &doc->root );

    /* Checks for '!DOCTYPE' */
    CheckDocType( doc );

    
    /* Checks to see if stylesheets are used to control the layout */
    if ( Level2_Enabled( doc )
         && ! CheckMissingStyleSheets( doc, &doc->root ) )
    {
        TY_(ReportAccessError)( doc, &doc->root, STYLE_SHEET_CONTROL_PRESENTATION );
    }

    /* Check to see if any list elements are found within the document */
    CheckForListElements( doc, &doc->root );

    /* Recursively apply all remaining checks to 
    ** each node in document.
    */
    AccessibilityCheckNode( doc, &doc->root );

    /* Cleanup */
    FreeAccessibilityChecks( doc );
}